

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

TextureCube *
glu::TextureCube::create
          (RenderContext *context,ContextInfo *contextInfo,Archive *archive,int numLevels,
          char **filenames)

{
  bool bVar1;
  size_type __n;
  reference pvVar2;
  TextureCube *this;
  TestError *this_00;
  TexDecompressionParams local_a4;
  int local_a0;
  allocator<tcu::CompressedTexture> local_99;
  int ndx;
  vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> levels;
  int numImages;
  FilePath local_70;
  undefined1 local_50 [8];
  string ext;
  char **filenames_local;
  int numLevels_local;
  Archive *archive_local;
  ContextInfo *contextInfo_local;
  RenderContext *context_local;
  
  ext.field_2._8_8_ = filenames;
  de::FilePath::FilePath(&local_70,*filenames);
  de::FilePath::getFileExtension_abi_cxx11_((string *)local_50,&local_70);
  de::FilePath::~FilePath(&local_70);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"pkm");
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unsupported file format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x1ca);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  levels.super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage._0_4_ = numLevels * 6;
  __n = (size_type)
        (int)levels.
             super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<tcu::CompressedTexture>::allocator(&local_99);
  std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::vector
            ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)&ndx,__n,
             &local_99);
  std::allocator<tcu::CompressedTexture>::~allocator(&local_99);
  for (local_a0 = 0;
      local_a0 <
      (int)levels.
           super__Vector_base<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage; local_a0 = local_a0 + 1) {
    pvVar2 = std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::
             operator[]((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)
                        &ndx,(long)local_a0);
    tcu::ImageIO::loadPKM(pvVar2,archive,*(char **)(ext.field_2._8_8_ + (long)local_a0 * 8));
  }
  this = (TextureCube *)operator_new(0x180);
  pvVar2 = std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::operator[]
                     ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)
                      &ndx,0);
  tcu::TexDecompressionParams::TexDecompressionParams(&local_a4,ASTCMODE_LAST);
  TextureCube(this,context,contextInfo,numLevels,pvVar2,&local_a4);
  std::vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_>::~vector
            ((vector<tcu::CompressedTexture,_std::allocator<tcu::CompressedTexture>_> *)&ndx);
  std::__cxx11::string::~string((string *)local_50);
  return this;
}

Assistant:

TextureCube* TextureCube::create (const RenderContext& context, const ContextInfo& contextInfo, const tcu::Archive& archive, int numLevels, const char* const* filenames)
{
	DE_ASSERT(numLevels > 0);

	std::string ext = de::FilePath(filenames[0]).getFileExtension();

	// \todo [2011-11-21 pyry] Support PNG images.
	if (ext == "pkm")
	{
		// Compressed texture.
		int								numImages	= numLevels*tcu::CUBEFACE_LAST;
		vector<tcu::CompressedTexture>	levels		(numImages);

		for (int ndx = 0; ndx < numImages; ndx++)
			tcu::ImageIO::loadPKM(levels[ndx], archive, filenames[ndx]);

		return new TextureCube(context, contextInfo, numLevels, &levels[0]);
	}
	else
		TCU_FAIL("Unsupported file format");
}